

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::get
          (FieldGeneratorTable *this,FieldDescriptor *field)

{
  Nonnull<const_char_*> failure_msg;
  char *pcVar1;
  int __c;
  int __c_00;
  int line;
  FieldGeneratorTable *__s;
  char *__s_00;
  Descriptor *local_20 [2];
  
  local_20[0] = field->containing_type_;
  __s = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                          (local_20,&this->descriptor_,"field->containing_type() == descriptor_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    pcVar1 = FieldDescriptor::index(field,(char *)__s,__c);
    __s_00 = (char *)0x0;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl
                            ((int)pcVar1,0,"field->index() >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pcVar1 = FieldDescriptor::index(field,__s_00,__c_00);
      return (this->fields_).
             super__Vector_base<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
             ._M_impl.super__Vector_impl_data._M_start + (int)pcVar1;
    }
    line = 0x212;
  }
  else {
    line = 0x211;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

const FieldGenerator& get(const FieldDescriptor* field) const {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    ABSL_DCHECK_GE(field->index(), 0);
    return fields_[static_cast<size_t>(field->index())];
  }